

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qglibnetworkinformationbackend.cpp
# Opt level: O1

void __thiscall
QGlibNetworkInformationBackend::QGlibNetworkInformationBackend(QGlibNetworkInformationBackend *this)

{
  int iVar1;
  undefined8 uVar2;
  
  QObject::QObject((QObject *)this,(QObject *)0x0);
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  *(undefined2 *)(this + 0x20) = 0;
  *(undefined ***)this = &PTR_metaObject_00104aa0;
  uVar2 = g_network_monitor_get_default();
  *(undefined8 *)(this + 0x28) = uVar2;
  *(undefined8 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  updateConnectivity((QGlibNetworkInformationBackend *)this);
  iVar1 = g_network_monitor_get_network_metered(*(undefined8 *)(this + 0x28));
  QNetworkInformationBackend::setMetered((QNetworkInformationBackend *)this,iVar1 != 0);
  uVar2 = g_signal_connect_data
                    (*(undefined8 *)(this + 0x28),"notify::connectivity",updateConnectivity,this,0,2
                    );
  *(undefined8 *)(this + 0x30) = uVar2;
  uVar2 = g_signal_connect_data
                    (*(undefined8 *)(this + 0x28),"notify::network-metered",updateMetered,this,0,2);
  *(undefined8 *)(this + 0x38) = uVar2;
  return;
}

Assistant:

QGlibNetworkInformationBackend::QGlibNetworkInformationBackend()
: networkMonitor(g_network_monitor_get_default())
{
    updateConnectivity(this);
    updateMetered(this);

    connectivityHandlerId = g_signal_connect_swapped(networkMonitor, "notify::connectivity",
                                                     G_CALLBACK(updateConnectivity), this);

    meteredHandlerId = g_signal_connect_swapped(networkMonitor, "notify::network-metered",
                                                G_CALLBACK(updateMetered), this);
}